

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O1

char * __cxxabiv1::anon_unknown_0::parse_vector_type<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  char *first_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar2;
  pointer psVar3;
  bool bVar4;
  size_type sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  String num;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_f8;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *local_b8;
  undefined8 local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  local_a8;
  value_type local_98;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_58;
  long local_38;
  
  if ((long)last - (long)first < 4) {
    return first;
  }
  if (*first != 'D') {
    return first;
  }
  if (first[1] != 'v') {
    return first;
  }
  pcVar7 = first + 2;
  pcVar8 = first;
  if ((byte)(first[2] - 0x31U) < 9) {
    pcVar6 = parse_number(pcVar7,last);
    if ((pcVar6 == last) || (*pcVar6 != '_')) {
LAB_001a223b:
      bVar4 = false;
    }
    else {
      first_00 = pcVar6 + 1;
      bVar4 = true;
      if (first_00 == last) goto joined_r0x001a218f;
      local_38 = (long)pcVar6 - (long)pcVar7;
      if (*first_00 == 'p') {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::
        basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
        ::_M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                    *)&local_d8,pcVar7,pcVar7 + local_38);
        std::operator+(&local_f8,"pixel vector[",&local_d8);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
        ::append(&local_f8,"]");
        local_98.first._M_string_length = local_f8._M_string_length;
        paVar1 = &local_f8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_f8._M_dataplus._M_p == paVar1) {
          local_a8._8_8_ = local_f8.field_2._8_8_;
          local_b8 = &local_a8;
        }
        else {
          local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                      *)local_f8._M_dataplus._M_p;
        }
        local_f8._M_string_length = 0;
        local_f8.field_2._M_local_buf[0] = '\0';
        local_98.first._M_dataplus._M_p = (pointer)&local_98.first.field_2;
        if (local_b8 == &local_a8) {
          local_98.first.field_2._8_8_ = local_a8._8_8_;
        }
        else {
          local_98.first._M_dataplus._M_p = (pointer)local_b8;
        }
        local_98.second._M_dataplus._M_p = (pointer)&local_98.second.field_2;
        local_b0 = 0;
        local_a8._M_allocated_capacity =
             (ulong)(uint7)local_f8.field_2._M_allocated_capacity._1_7_ << 8;
        local_98.second._M_string_length = 0;
        local_98.second.field_2._M_local_buf[0] = '\0';
        local_f8._M_dataplus._M_p = (pointer)paVar1;
        local_b8 = &local_a8;
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_98);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(&local_98);
        if (local_b8 != &local_a8) {
          free(local_b8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar1) {
          free(local_f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          free(local_d8._M_dataplus._M_p);
        }
        pcVar8 = pcVar6 + 2;
      }
      else {
        pcVar6 = parse_type<__cxxabiv1::(anonymous_namespace)::Db>(first_00,last,db);
        if (pcVar6 != first_00) {
          if ((db->names).
              super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (db->names).
              super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001a223b;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::
          basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
          ::_M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                      *)&local_d8,pcVar7,pcVar7 + local_38);
          std::operator+(&local_f8," vector[",&local_d8);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          ::append(&local_f8,"]");
          sVar5 = local_f8._M_string_length;
          paVar1 = &local_98.first.field_2;
          paVar2 = &local_f8.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
               *)local_f8._M_dataplus._M_p == paVar2) {
            local_98.first.field_2._8_8_ = local_f8.field_2._8_8_;
            local_98.first._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_98.first._M_dataplus._M_p = local_f8._M_dataplus._M_p;
          }
          local_98.first._M_string_length = local_f8._M_string_length;
          local_f8._M_string_length = 0;
          local_f8.field_2._M_local_buf[0] = '\0';
          local_f8._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          ::_M_append(&(db->names).
                       super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].first,
                      local_98.first._M_dataplus._M_p,sVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
               *)local_98.first._M_dataplus._M_p != paVar1) {
            free(local_98.first._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
               *)local_f8._M_dataplus._M_p != paVar2) {
            free(local_f8._M_dataplus._M_p);
          }
          pcVar8 = pcVar6;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            free(local_d8._M_dataplus._M_p);
          }
        }
      }
      bVar4 = true;
    }
    goto joined_r0x001a218f;
  }
  local_98.first._M_dataplus._M_p = (pointer)&local_98.first.field_2;
  local_98.first._M_string_length = 0;
  local_98.first.field_2._M_allocated_capacity =
       local_98.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (first[2] == '_') {
LAB_001a20cd:
    bVar4 = true;
    if ((((pcVar7 != last) && (*pcVar7 == '_')) && (pcVar7 = pcVar7 + 1, pcVar7 != last)) &&
       (pcVar6 = parse_type<__cxxabiv1::(anonymous_namespace)::Db>(pcVar7,last,db), pcVar6 != pcVar7
       )) {
      if ((db->names).
          super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (db->names).
          super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001a2173;
      std::operator+(&local_58," vector[",&local_98.first);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::append(&local_58,"]");
      sVar5 = local_58._M_string_length;
      paVar1 = &local_58.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_58._M_dataplus._M_p == paVar1) {
        local_d8.field_2._8_8_ = local_58.field_2._8_8_;
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8._M_dataplus._M_p = local_58._M_dataplus._M_p;
      }
      local_d8._M_string_length = local_58._M_string_length;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::_M_append(&(db->names).
                   super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].first,local_d8._M_dataplus._M_p,
                  sVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        free(local_d8._M_dataplus._M_p);
      }
      pcVar8 = pcVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        free(local_58._M_dataplus._M_p);
      }
    }
  }
  else {
    pcVar6 = parse_expression<__cxxabiv1::(anonymous_namespace)::Db>(pcVar7,last,db);
    bVar4 = true;
    if (pcVar6 != pcVar7) {
      psVar3 = (db->names).
               super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((db->names).
          super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
          ._M_impl.super__Vector_impl_data._M_start == psVar3) {
        bVar4 = false;
      }
      else {
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::move_full(&local_f8,psVar3 + -1);
        (anonymous_namespace)::parse_vector_type<__cxxabiv1::(anonymous_namespace)::Db>();
        pcVar7 = pcVar6;
      }
    }
    if (bVar4) goto LAB_001a20cd;
LAB_001a2173:
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_98.first._M_dataplus._M_p != &local_98.first.field_2) {
    free(local_98.first._M_dataplus._M_p);
  }
joined_r0x001a218f:
  if (bVar4) {
    return pcVar8;
  }
  return first;
}

Assistant:

const char*
parse_vector_type(const char* first, const char* last, C& db)
{
    if (last - first > 3 && first[0] == 'D' && first[1] == 'v')
    {
        if ('1' <= first[2] && first[2] <= '9')
        {
            const char* t = parse_number(first+2, last);
            if (t == last || *t != '_')
                return first;
            const char* num = first + 2;
            size_t sz = static_cast<size_t>(t - num);
            if (++t != last)
            {
                if (*t != 'p')
                {
                    const char* t1 = parse_type(t, last, db);
                    if (t1 != t)
                    {
                        if (db.names.empty())
                            return first;
                        db.names.back().first += " vector[" + typename C::String(num, sz) + "]";
                        first = t1;
                    }
                }
                else
                {
                    ++t;
                    db.names.push_back("pixel vector[" + typename C::String(num, sz) + "]");
                    first = t;
                }
            }
        }
        else
        {
            typename C::String num;
            const char* t1 = first+2;
            if (*t1 != '_')
            {
                const char* t = parse_expression(t1, last, db);
                if (t != t1)
                {
                    if (db.names.empty())
                        return first;
                    num = db.names.back().move_full();
                    db.names.pop_back();
                    t1 = t;
                }
            }
            if (t1 != last && *t1 == '_' && ++t1 != last)
            {
                const char* t = parse_type(t1, last, db);
                if (t != t1)
                {
                    if (db.names.empty())
                        return first;
                    db.names.back().first += " vector[" + num + "]";
                    first = t;
                }
            }
        }
    }
    return first;
}